

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorRGBA8(uchar *r,uchar *g,uchar *b,uchar *a,uchar *in,size_t i,
                       LodePNGColorMode *mode)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 *in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_R8;
  long in_R9;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  uint highest;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t *in_stack_ffffffffffffffc0;
  
  if (*(int *)j_1 == 0) {
    if (*(int *)(j_1 + 4) == 8) {
      bVar1 = *(byte *)(in_R8 + in_R9);
      *in_RDX = bVar1;
      *in_RSI = bVar1;
      *in_RDI = bVar1;
      if ((*(int *)(j_1 + 0x18) == 0) || ((uint)*in_RDI != *(uint *)(j_1 + 0x1c))) {
        *in_RCX = 0xff;
      }
      else {
        *in_RCX = 0;
      }
    }
    else if (*(int *)(j_1 + 4) == 0x10) {
      bVar1 = *(byte *)(in_R8 + in_R9 * 2);
      *in_RDX = bVar1;
      *in_RSI = bVar1;
      *in_RDI = bVar1;
      if ((*(int *)(j_1 + 0x18) == 0) ||
         ((uint)*(byte *)(in_R8 + in_R9 * 2) * 0x100 + (uint)*(byte *)(in_R8 + 1 + in_R9 * 2) !=
          *(int *)(j_1 + 0x1c))) {
        *in_RCX = 0xff;
      }
      else {
        *in_RCX = 0;
      }
    }
    else {
      uVar2 = *(undefined4 *)(j_1 + 4);
      uVar3 = readBitsFromReversedStream
                        ((size_t *)(in_R9 * (ulong)*(uint *)(j_1 + 4)),
                         (uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0);
      bVar1 = (byte)((uVar3 * 0xff) / ((1 << ((byte)uVar2 & 0x1f)) - 1U));
      *in_RDX = bVar1;
      *in_RSI = bVar1;
      *in_RDI = bVar1;
      if ((*(int *)(j_1 + 0x18) == 0) || (uVar3 != *(uint *)(j_1 + 0x1c))) {
        *in_RCX = 0xff;
      }
      else {
        *in_RCX = 0;
      }
    }
  }
  else if (*(int *)j_1 == 2) {
    if (*(int *)(j_1 + 4) == 8) {
      *in_RDI = *(byte *)(in_R8 + in_R9 * 3);
      *in_RSI = *(byte *)(in_R8 + 1 + in_R9 * 3);
      *in_RDX = *(byte *)(in_R8 + 2 + in_R9 * 3);
      if (((*(int *)(j_1 + 0x18) == 0) || ((uint)*in_RDI != *(uint *)(j_1 + 0x1c))) ||
         (((uint)*in_RSI != *(uint *)(j_1 + 0x20) || ((uint)*in_RDX != *(uint *)(j_1 + 0x24))))) {
        *in_RCX = 0xff;
      }
      else {
        *in_RCX = 0;
      }
    }
    else {
      *in_RDI = *(byte *)(in_R8 + in_R9 * 6);
      *in_RSI = *(byte *)(in_R8 + 2 + in_R9 * 6);
      *in_RDX = *(byte *)(in_R8 + 4 + in_R9 * 6);
      if ((((*(int *)(j_1 + 0x18) == 0) ||
           ((uint)*(byte *)(in_R8 + in_R9 * 6) * 0x100 + (uint)*(byte *)(in_R8 + 1 + in_R9 * 6) !=
            *(int *)(j_1 + 0x1c))) ||
          ((uint)*(byte *)(in_R8 + 2 + in_R9 * 6) * 0x100 + (uint)*(byte *)(in_R8 + 3 + in_R9 * 6)
           != *(int *)(j_1 + 0x20))) ||
         ((uint)*(byte *)(in_R8 + 4 + in_R9 * 6) * 0x100 + (uint)*(byte *)(in_R8 + 5 + in_R9 * 6) !=
          *(int *)(j_1 + 0x24))) {
        *in_RCX = 0xff;
      }
      else {
        *in_RCX = 0;
      }
    }
  }
  else if (*(int *)j_1 == 3) {
    if (*(int *)(j_1 + 4) == 8) {
      uVar3 = (uint)*(byte *)(in_R8 + in_R9);
    }
    else {
      uVar3 = readBitsFromReversedStream
                        (in_stack_ffffffffffffffc0,
                         (uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_R9 * (ulong)*(uint *)(j_1 + 4));
    }
    if ((ulong)uVar3 < *(ulong *)(j_1 + 0x10)) {
      *in_RDI = *(byte *)(*(long *)(j_1 + 8) + (ulong)(uVar3 << 2));
      *in_RSI = *(byte *)(*(long *)(j_1 + 8) + (ulong)(uVar3 * 4 + 1));
      *in_RDX = *(byte *)(*(long *)(j_1 + 8) + (ulong)(uVar3 * 4 + 2));
      *in_RCX = *(undefined1 *)(*(long *)(j_1 + 8) + (ulong)(uVar3 * 4 + 3));
    }
    else {
      *in_RDX = 0;
      *in_RSI = 0;
      *in_RDI = 0;
      *in_RCX = 0xff;
    }
  }
  else if (*(int *)j_1 == 4) {
    if (*(int *)(j_1 + 4) == 8) {
      bVar1 = *(byte *)(in_R8 + in_R9 * 2);
      *in_RDX = bVar1;
      *in_RSI = bVar1;
      *in_RDI = bVar1;
      *in_RCX = *(undefined1 *)(in_R8 + 1 + in_R9 * 2);
    }
    else {
      bVar1 = *(byte *)(in_R8 + in_R9 * 4);
      *in_RDX = bVar1;
      *in_RSI = bVar1;
      *in_RDI = bVar1;
      *in_RCX = *(undefined1 *)(in_R8 + 2 + in_R9 * 4);
    }
  }
  else if (*(int *)j_1 == 6) {
    if (*(int *)(j_1 + 4) == 8) {
      *in_RDI = *(byte *)(in_R8 + in_R9 * 4);
      *in_RSI = *(byte *)(in_R8 + 1 + in_R9 * 4);
      *in_RDX = *(byte *)(in_R8 + 2 + in_R9 * 4);
      *in_RCX = *(undefined1 *)(in_R8 + 3 + in_R9 * 4);
    }
    else {
      *in_RDI = *(byte *)(in_R8 + in_R9 * 8);
      *in_RSI = *(byte *)(in_R8 + 2 + in_R9 * 8);
      *in_RDX = *(byte *)(in_R8 + 4 + in_R9 * 8);
      *in_RCX = *(undefined1 *)(in_R8 + 6 + in_R9 * 8);
    }
  }
  return;
}

Assistant:

static void getPixelColorRGBA8(unsigned char* r, unsigned char* g,
	unsigned char* b, unsigned char* a,
	const unsigned char* in, size_t i,
	const LodePNGColorMode* mode)
{
	if (mode->colortype == LCT_GREY)
	{
		if (mode->bitdepth == 8)
		{
			*r = *g = *b = in[i];
			if (mode->key_defined && *r == mode->key_r) *a = 0;
			else *a = 255;
		}
		else if (mode->bitdepth == 16)
		{
			*r = *g = *b = in[i * 2 + 0];
			if (mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
			else *a = 255;
		}
		else
		{
			unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
			size_t j = i * mode->bitdepth;
			unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
			*r = *g = *b = (value * 255) / highest;
			if (mode->key_defined && value == mode->key_r) *a = 0;
			else *a = 255;
		}
	}
	else if (mode->colortype == LCT_RGB)
	{
		if (mode->bitdepth == 8)
		{
			*r = in[i * 3 + 0]; *g = in[i * 3 + 1]; *b = in[i * 3 + 2];
			if (mode->key_defined && *r == mode->key_r && *g == mode->key_g && *b == mode->key_b) *a = 0;
			else *a = 255;
		}
		else
		{
			*r = in[i * 6 + 0];
			*g = in[i * 6 + 2];
			*b = in[i * 6 + 4];
			if (mode->key_defined && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
				&& 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
				&& 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
			else *a = 255;
		}
	}
	else if (mode->colortype == LCT_PALETTE)
	{
		unsigned index;
		if (mode->bitdepth == 8) index = in[i];
		else
		{
			size_t j = i * mode->bitdepth;
			index = readBitsFromReversedStream(&j, in, mode->bitdepth);
		}

		if (index >= mode->palettesize)
		{
			/*This is an error according to the PNG spec, but common PNG decoders make it black instead.
			Done here too, slightly faster due to no error handling needed.*/
			*r = *g = *b = 0;
			*a = 255;
		}
		else
		{
			*r = mode->palette[index * 4 + 0];
			*g = mode->palette[index * 4 + 1];
			*b = mode->palette[index * 4 + 2];
			*a = mode->palette[index * 4 + 3];
		}
	}
	else if (mode->colortype == LCT_GREY_ALPHA)
	{
		if (mode->bitdepth == 8)
		{
			*r = *g = *b = in[i * 2 + 0];
			*a = in[i * 2 + 1];
		}
		else
		{
			*r = *g = *b = in[i * 4 + 0];
			*a = in[i * 4 + 2];
		}
	}
	else if (mode->colortype == LCT_RGBA)
	{
		if (mode->bitdepth == 8)
		{
			*r = in[i * 4 + 0];
			*g = in[i * 4 + 1];
			*b = in[i * 4 + 2];
			*a = in[i * 4 + 3];
		}
		else
		{
			*r = in[i * 8 + 0];
			*g = in[i * 8 + 2];
			*b = in[i * 8 + 4];
			*a = in[i * 8 + 6];
		}
	}
}